

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O0

int __thiscall MD5::init(MD5 *this,EVP_PKEY_CTX *ctx)

{
  MD5 *this_local;
  
  this->finalized = false;
  this->count[0] = 0;
  this->count[1] = 0;
  this->state[0] = 0x67452301;
  this->state[1] = 0xefcdab89;
  this->state[2] = 0x98badcfe;
  this->state[3] = 0x10325476;
  return (int)this;
}

Assistant:

void MD5::init()
{
  finalized=false;
 
  count[0] = 0;
  count[1] = 0;
 
  // load magic initialization constants.
  state[0] = 0x67452301;
  state[1] = 0xefcdab89;
  state[2] = 0x98badcfe;
  state[3] = 0x10325476;
}